

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

size_t obu_memmove_unsafe(size_t obu_header_size,size_t obu_payload_size,uint8_t *data)

{
  size_t sVar1;
  long in_RDX;
  uint64_t in_RSI;
  long in_RDI;
  size_t move_size;
  size_t move_src_offset;
  size_t move_dst_offset;
  size_t length_field_size;
  
  sVar1 = aom_uleb_size_in_bytes(in_RSI);
  memmove((void *)(in_RDX + in_RDI + sVar1),(void *)(in_RDX + in_RDI),in_RSI);
  return sVar1;
}

Assistant:

static size_t obu_memmove_unsafe(size_t obu_header_size,
                                 size_t obu_payload_size, uint8_t *data) {
  const size_t length_field_size = aom_uleb_size_in_bytes(obu_payload_size);
  const size_t move_dst_offset = obu_header_size + length_field_size;
  const size_t move_src_offset = obu_header_size;
  const size_t move_size = obu_payload_size;
  memmove(data + move_dst_offset, data + move_src_offset, move_size);
  return length_field_size;
}